

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

void CVmPack::unpack_group
               (CVmPackPos *p,CVmObjList *retlst_par,int *retcnt_par,CVmPackGroup *group,
               int list_per_iter)

{
  char *buf;
  vm_obj_id_t vVar1;
  CVmDataSource *pCVar2;
  bool bVar3;
  uint16_t tmp;
  int iVar4;
  int iVar5;
  wchar_t wVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CVmObjList *retlst;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  vm_obj_id_t *pvVar8;
  vm_obj_id_t *retcnt;
  int cnt;
  int grpcnt;
  vm_val_t cntval;
  vm_obj_id_t local_60 [2];
  CVmObjList *local_58;
  int *local_50;
  CVmDataSource *local_48;
  vm_val_t local_40;
  
  pCVar2 = group->ds;
  if ((group->num_iters == -2) || (group->up_to_iters != 0)) {
    iVar4 = (*pCVar2->_vptr_CVmDataSource[7])(pCVar2);
    iVar5 = (*pCVar2->_vptr_CVmDataSource[6])(pCVar2);
    if (CONCAT44(extraout_var_00,iVar5) <= CONCAT44(extraout_var,iVar4)) {
      (p->p).p_ = (group->start).p.p_;
      p->len = (group->start).len;
      p->idx = (group->start).idx;
      skip_group(p,group->close_paren);
      return;
    }
  }
  local_60[1] = 0;
  retlst = retlst_par;
  local_58 = retlst_par;
  local_50 = retcnt_par;
  local_48 = pCVar2;
  retcnt = (vm_obj_id_t *)retcnt_par;
  if (list_per_iter != 0) {
    retlst = create_group_sublist(retlst_par,retcnt_par);
    retcnt = local_60 + 1;
    pCVar2 = local_48;
  }
  do {
    CVmPackPos::getch(p);
    if (p->len == 0) {
      return;
    }
    wVar6 = CVmPackPos::getch(p);
    if ((wVar6 == L'[') || (wVar6 == L'(')) {
      pvVar8 = (vm_obj_id_t *)0x0;
LAB_002b1a05:
      unpack_subgroup(p,retlst,(int *)retcnt,group,(int *)pvVar8);
LAB_002b1a0a:
      bVar3 = true;
    }
    else {
      if (wVar6 != group->close_paren) {
        if (wVar6 == L'/') {
          if (retcnt == (vm_obj_id_t *)0x0) {
            err_throw_a(0x6b,1,0,(ulong)(uint)p->idx);
          }
          vVar1 = *retcnt;
          *retcnt = vVar1 - 1;
          buf = (retlst->super_CVmObjCollection).super_CVmObject.ext_ + (long)(int)vVar1 * 5 + -3;
          local_40.typ = (vm_datatype_t)*buf;
          vmb_get_dh_val(buf,&local_40);
          uVar7 = local_40.val.obj;
          if (local_40.typ != VM_INT) {
            uVar7 = vm_val_t::nonint_cast_to_int(&local_40);
          }
          local_60[0] = uVar7;
          CVmPackPos::inc(p);
          wVar6 = CVmPackPos::getch(p);
          if ((wVar6 == L'[') || (wVar6 == L'(')) {
            pvVar8 = local_60;
            goto LAB_002b1a05;
          }
          pvVar8 = local_60;
        }
        else {
          pvVar8 = (vm_obj_id_t *)0x0;
        }
        unpack_iter_item(p,retlst,(int *)retcnt,group,(int *)pvVar8);
        goto LAB_002b1a0a;
      }
      group->cur_iter = group->cur_iter + 1;
      if (list_per_iter != 0) {
        *(short *)(retlst->super_CVmObjCollection).super_CVmObject.ext_ = (short)*retcnt;
      }
      if (group->num_iters == -2) {
        iVar4 = (*pCVar2->_vptr_CVmDataSource[7])(pCVar2);
        iVar5 = (*pCVar2->_vptr_CVmDataSource[6])(pCVar2);
        if (CONCAT44(extraout_var_02,iVar5) <= CONCAT44(extraout_var_01,iVar4)) goto LAB_002b1b22;
LAB_002b1aaf:
        if (group->up_to_iters != 0) {
          iVar4 = (*pCVar2->_vptr_CVmDataSource[7])(pCVar2);
          iVar5 = (*pCVar2->_vptr_CVmDataSource[6])(pCVar2);
          if (CONCAT44(extraout_var_04,iVar5) <= CONCAT44(extraout_var_03,iVar4)) goto LAB_002b1b22;
        }
        (p->p).p_ = (group->start).p.p_;
        p->len = (group->start).len;
        p->idx = (group->start).idx;
        iVar4 = (*group->ds->_vptr_CVmDataSource[7])();
        group->stream_ofs = CONCAT44(extraout_var_05,iVar4);
        bVar3 = true;
        if (list_per_iter != 0) {
          retlst = create_group_sublist(local_58,local_50);
          local_60[1] = 0;
        }
      }
      else {
        if (group->cur_iter <= group->num_iters) goto LAB_002b1aaf;
LAB_002b1b22:
        bVar3 = false;
      }
    }
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void CVmPack::unpack_group(VMG_ CVmPackPos *p,
                           CVmObjList *retlst_par, int *retcnt_par,
                           CVmPackGroup *group, int list_per_iter)
{
    /* get the data source */
    CVmDataSource *src = group->ds;

    /* 
     *   If the group has an "up to" count (e.g., "30*"), check to see if
     *   we're already at EOF, and if so don't unpack anything - an iteration
     *   count of zero is valid for an up-to count. 
     */
    if ((group->num_iters == ITER_STAR || group->up_to_iters)
        && src->get_pos() >= src->get_size())
    {
        /* skip the group in the source */
        p->set(&group->start);
        skip_group(p, group->close_paren);

        /* we're done */
        return;
    }

    /* assume we'll unpack directly into the parent list */
    CVmObjList *retlst = retlst_par;
    int *retcnt = retcnt_par;

    /* 
     *   if we're unpacking into a per-instance sublist, create the sublist
     *   for the first iteration, and set this as the output list instead of
     *   unpacking directly into the parent list
     */
    int grpcnt = 0;
    if (list_per_iter)
    {
        retlst = create_group_sublist(vmg_ retlst_par, retcnt_par);
        retcnt = &grpcnt;
    }

    /* run through the format list */
    while (p->more())
    {
        /* check for group entry/exit and repeat counts */
        wchar_t c = p->getch();
        if (c == '(' || c == '[')
        {
            /* start of a group - unpack the sub-group */
            unpack_subgroup(vmg_ p, retlst, *retcnt, group, 0);
        }
        else if (c == group->close_paren)
        {
            /* end of group - count the completed iteration */
            group->cur_iter++;

            /* 
             *   if we're unpacking into a per-iteration sublist, note the
             *   final group count in the sublist 
             */
            if (list_per_iter)
                retlst->cons_set_len(*retcnt);

            /* 
             *   We're done with the group if (a) we have a '*' iteration
             *   count, and we're at end of file, or (b) we've reached the
             *   desired iteration count.  If done, simply return to the
             *   enclosing group. 
             */
            if (group->num_iters == ITER_STAR
                ? src->get_pos() >= src->get_size()
                : group->cur_iter > group->num_iters)
                return;

            /* 
             *   if we have an 'up to' iteration count, stop if we're at EOF
             *   even if we haven't exhausted the numeric iteration count 
             */
            if (group->up_to_iters && src->get_pos() >= src->get_size())
                return;

            /* return to the start of the group template for the next round */
            p->set(&group->start);
            group->stream_ofs = group->ds->get_pos();

            /* 
             *   If we're unpacking into a sublist per iteration, create the
             *   new sublist for the new iteration. 
             */
            if (list_per_iter)
            {
                retlst = create_group_sublist(vmg_ retlst_par, retcnt_par);
                grpcnt = 0;
            }
        }
        else if (c == '/')
        {
            /*
             *   Repeat count prefix.  Remove the preceding return list
             *   element and interpret it as an integer.  Make sure there
             *   actually is an item in the list - it's an error if not.  
             */
            if (retcnt == 0)
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());
            
            /* remove the item and cast it to integer */
            vm_val_t cntval;
            retlst->get_element(--(*retcnt), &cntval);
            int cnt = (int)cntval.cast_to_int(vmg0_);

            /* skip the '/' and check what follows */
            p->inc();
            if ((c = p->getch()) == '(' || c == '[')
            {
                /* it's a group - unpack the group with the count */
                unpack_subgroup(vmg_ p, retlst, *retcnt, group, &cnt);
            }
            else
            {
                /* it's a single item - unpack the repeated items */
                unpack_iter_item(vmg_ p, retlst, *retcnt, group, &cnt);
            }
        }
        else
        {
            /* it's a regular item, possibly iterated - unpack it */
            unpack_iter_item(vmg_ p, retlst, *retcnt, group, 0);
        }
    }
}